

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lq.c
# Opt level: O0

lqDB * lqCreateDatabase(float originx,float originy,float originz,float sizex,float sizey,
                       float sizez,int divx,int divy,int divz)

{
  lqDB *plVar1;
  float in_EDX;
  float in_ESI;
  float in_EDI;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  lqInternalDB *lq;
  int in_stack_ffffffffffffffcc;
  float in_stack_ffffffffffffffd8;
  
  plVar1 = (lqDB *)malloc(0x38);
  lqInitDatabase((lqInternalDB *)CONCAT44(in_XMM2_Da,in_XMM3_Da),in_XMM4_Da,in_XMM5_Da,in_EDI,in_ESI
                 ,in_EDX,in_stack_ffffffffffffffd8,(int)((ulong)plVar1 >> 0x20),(int)plVar1,
                 in_stack_ffffffffffffffcc);
  return plVar1;
}

Assistant:

lqInternalDB* lqCreateDatabase (float originx, float originy, float originz,
				float sizex, float sizey, float sizez,
				int divx, int divy, int divz)
{
    lqInternalDB* lq = ((lqInternalDB*) malloc (sizeof (lqInternalDB)));

    lqInitDatabase (lq,
		    originx, originy, originz,
		    sizex, sizey, sizez,
		    divx, divy, divz);
    return lq;
}